

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_logger.hpp
# Opt level: O2

void __thiscall
duckdb::HTTPLogger::Log<duckdb_httplib::Request,duckdb_httplib::Response>
          (HTTPLogger *this,Request *req,Response *res)

{
  ClientConfig *pCVar1;
  IOException *this_00;
  int *piVar2;
  char *params_1;
  allocator local_269;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ofstream out;
  byte abStack_208 [480];
  
  pCVar1 = ClientConfig::GetConfig(this->context);
  ::std::mutex::lock(&this->lock);
  if ((pCVar1->http_logging_output)._M_string_length == 0) {
    ::std::__cxx11::stringstream::stringstream((stringstream *)&out);
    TemplatedWriteRequests<std::__cxx11::stringstream,duckdb_httplib::Request,duckdb_httplib::Response>
              ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,req,
               res);
    ::std::__cxx11::stringbuf::str();
    Printer::Print(&local_268);
    ::std::__cxx11::string::~string((string *)&local_268);
    ::std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  }
  else {
    ::std::ofstream::ofstream(&out,(string *)&pCVar1->http_logging_output,_S_app);
    TemplatedWriteRequests<std::ofstream,duckdb_httplib::Request,duckdb_httplib::Response>
              (&out,req,res);
    ::std::ofstream::close();
    if ((abStack_208[*(long *)(_out + -0x18)] & 5) != 0) {
      this_00 = (IOException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_268,"Failed to write HTTP log to file \"%s\": %s",&local_269);
      ::std::__cxx11::string::string((string *)&local_248,(string *)&pCVar1->http_logging_output);
      piVar2 = __errno_location();
      params_1 = strerror(*piVar2);
      IOException::IOException<std::__cxx11::string,char*>(this_00,&local_268,&local_248,params_1);
      __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::ofstream::~ofstream(&out);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return;
}

Assistant:

void Log(const REQUEST &req, const RESPONSE &res) {
		const auto &config = ClientConfig::GetConfig(context);
		D_ASSERT(config.enable_http_logging);

		lock_guard<mutex> guard(lock);
		if (config.http_logging_output.empty()) {
			stringstream out;
			TemplatedWriteRequests(out, req, res);
			Printer::Print(out.str());
		} else {
			ofstream out(config.http_logging_output, ios::app);
			TemplatedWriteRequests(out, req, res);
			out.close();
			// Throw an IO exception if it fails to write to the file
			if (out.fail()) {
				throw IOException("Failed to write HTTP log to file \"%s\": %s", config.http_logging_output,
				                  strerror(errno));
			}
		}
	}